

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_read_require_instance(yang_type *stype,int req)

{
  int req_local;
  yang_type *stype_local;
  
  if ((stype->base == LY_TYPE_DER) || (stype->base == LY_TYPE_LEAFREF)) {
    if ((stype->type->info).lref.req == '\0') {
      (stype->type->info).lref.req = (int8_t)req;
      stype->base = LY_TYPE_LEAFREF;
      stype_local._4_4_ = 0;
    }
    else {
      ly_vlog(LYE_TOOMANY,LY_VLOG_NONE,(void *)0x0,"require-instance","type");
      stype_local._4_4_ = 1;
    }
  }
  else {
    ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"require-instance");
    stype_local._4_4_ = 1;
  }
  return stype_local._4_4_;
}

Assistant:

int
yang_read_require_instance(struct yang_type *stype, int req)
{
    if (stype->base && (stype->base != LY_TYPE_LEAFREF)) {
        LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, "require-instance");
        return EXIT_FAILURE;
    }
    if (stype->type->info.lref.req) {
        LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, "require-instance", "type");
        return EXIT_FAILURE;
    }
    stype->type->info.lref.req = req;
    stype->base = LY_TYPE_LEAFREF;
    return EXIT_SUCCESS;
}